

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<int,false>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  Var pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int local_34;
  
  piVar4 = (int *)this->buffer;
  uVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar2 = this->byteOffset;
  uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar2 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar6) {
LAB_00c03cd2:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  lVar11 = 0;
  iVar3 = *piVar4;
LAB_00c03c16:
  do {
    local_34 = iVar3;
    lVar10 = lVar11 * 4;
    lVar12 = lVar11;
    do {
      while( true ) {
        lVar10 = lVar10 + 4;
        lVar11 = lVar12 + 1;
        if (lVar11 - (ulong)uVar1 == 1) {
          pvVar9 = JavascriptNumber::ToVarNoCheck((double)local_34,scriptContext);
          return pvVar9;
        }
        uVar2 = this->byteOffset;
        uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x71])();
        if ((ulong)uVar7 < (ulong)uVar2 + lVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x9ec,
                                      "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                      ,
                                      "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                     );
          if (!bVar6) goto LAB_00c03cd2;
          *puVar8 = 0;
        }
        iVar3 = piVar4[lVar12];
        lVar12 = lVar11;
        if (!findMax) break;
        if (local_34 < iVar3) goto LAB_00c03c16;
      }
    } while (local_34 <= iVar3);
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }